

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
emplaceRealloc<slang::ast::Scope_const&,slang::syntax::TypeParameterDeclarationSyntax_const&,slang::syntax::TypeAssignmentSyntax_const&,bool&,bool&,std::span<slang::syntax::AttributeInstanceSyntax_const*const,18446744073709551615ul>&>
          (SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *this,pointer pos,
          Scope *args,TypeParameterDeclarationSyntax *args_1,TypeAssignmentSyntax *args_2,
          bool *args_3,bool *args_4,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> *args_5)

{
  size_type sVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes;
  size_type sVar2;
  TypeAssignmentSyntax *decl;
  iterator pPVar3;
  long lVar4;
  pointer pPVar5;
  iterator pPVar6;
  iterator pPVar7;
  ParameterDecl *in_RCX;
  iterator in_RSI;
  SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *in_RDI;
  Scope *in_R8;
  TypeParameterDeclarationSyntax *in_R9;
  long in_stack_00000010;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  ParameterDecl *__result;
  ParameterDecl *in_stack_ffffffffffffff68;
  ParameterDecl *in_stack_ffffffffffffff70;
  SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *in_stack_ffffffffffffff78;
  __extent_storage<18446744073709551615UL> _Var8;
  
  sVar1 = in_RDI->len;
  _Var8._M_extent_value = (size_t)in_RDI;
  sVar2 = max_size((SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *)0x945e9f);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  decl = (TypeAssignmentSyntax *)
         calculateGrowth(in_stack_ffffffffffffff78,(size_type)in_stack_ffffffffffffff70);
  pPVar7 = in_RSI;
  pPVar3 = begin(in_RDI);
  lVar4 = (long)in_RSI - (long)pPVar3 >> 6;
  pPVar5 = (pointer)operator_new(0x945f01);
  __result = *(ParameterDecl **)(in_stack_00000010 + 8);
  attributes._M_extent._M_extent_value = _Var8._M_extent_value;
  attributes._M_ptr = (pointer)pPVar7;
  ast::DefinitionSymbol::ParameterDecl::ParameterDecl
            (in_RCX,in_R8,in_R9,decl,SUB81((ulong)lVar4 >> 0x38,0),SUB81((ulong)lVar4 >> 0x30,0),
             attributes);
  pPVar3 = pPVar7;
  pPVar6 = end(in_RDI);
  if (pPVar7 == pPVar6) {
    begin(in_RDI);
    pPVar7 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::DefinitionSymbol::ParameterDecl*,slang::ast::DefinitionSymbol::ParameterDecl*>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,__result);
  }
  else {
    begin(in_RDI);
    std::
    uninitialized_move<slang::ast::DefinitionSymbol::ParameterDecl*,slang::ast::DefinitionSymbol::ParameterDecl*>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,__result);
    pPVar7 = end(in_RDI);
    std::
    uninitialized_move<slang::ast::DefinitionSymbol::ParameterDecl*,slang::ast::DefinitionSymbol::ParameterDecl*>
              (pPVar3,in_stack_ffffffffffffff68,__result);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pPVar7);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = (size_type)decl;
  in_RDI->data_ = pPVar5;
  return pPVar5 + lVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}